

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_print_longpath.c
# Opt level: O0

void test_print_longpath(void)

{
  wchar_t wVar1;
  size_t sVar2;
  int local_824;
  int local_820;
  int k;
  int j;
  int i;
  char buff [2048];
  char *reffile;
  
  extract_reference_file("test_print_longpath.tar.Z");
  memset(&j,0,0x800);
  for (local_824 = 0; local_824 < 4; local_824 = local_824 + 1) {
    for (local_820 = 0; local_820 < local_824 + 1; local_820 = local_820 + 1) {
      for (k = 0; k < 10; k = k + 1) {
        sVar2 = strlen((char *)&j);
        strncat((char *)&j,"0123456789",0x7ff - sVar2);
      }
      sVar2 = strlen((char *)&j);
      strncat((char *)&j,"/",0x7ff - sVar2);
    }
    sVar2 = strlen((char *)&j);
    strncat((char *)&j,"\n",0x7ff - sVar2);
  }
  buff[0x7f7] = '\0';
  wVar1 = systemf("%s -tf %s >test.out 2>test.err",testprog,"test_print_longpath.tar.Z");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_print_longpath.c"
                      ,L' ',0,"0",(long)wVar1,
                      "systemf(\"%s -tf %s >test.out 2>test.err\", testprog, reffile)",(void *)0x0);
  assertion_text_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_print_longpath.c"
             ,L'!',(char *)&j,"test.out");
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_print_longpath.c"
             ,L'\"',"test.err");
  return;
}

Assistant:

DEFINE_TEST(test_print_longpath)
{
	const char *reffile = "test_print_longpath.tar.Z";
	char buff[2048];
	int i, j, k;

	/* Reference file has one entry "file" with a very old timestamp. */
	extract_reference_file(reffile);

	/* Build long path pattern. */
	memset(buff, 0, sizeof(buff));
	for (k = 0; k < 4; k++) {
		for (j = 0; j < k+1; j++) {
			for (i = 0; i < 10; i++)
				strncat(buff, "0123456789",
				    sizeof(buff) - strlen(buff) -1);
			strncat(buff, "/", sizeof(buff) - strlen(buff) -1);
		}
		strncat(buff, "\n", sizeof(buff) - strlen(buff) -1);
	}
	buff[sizeof(buff)-1] = '\0';

	assertEqualInt(0,
	    systemf("%s -tf %s >test.out 2>test.err", testprog, reffile));
	assertTextFileContents(buff, "test.out");
	assertEmptyFile("test.err");
}